

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O3

void * __thiscall
icu_63::Hashtable::put(Hashtable *this,UnicodeString *key,void *value,UErrorCode *status)

{
  UHashtable *hash;
  UnicodeString *this_00;
  void *pvVar1;
  
  hash = this->hash;
  this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)key);
  if (this_00 != (UnicodeString *)0x0) {
    UnicodeString::UnicodeString(this_00,key);
  }
  pvVar1 = uhash_put_63(hash,this_00,value,status);
  return pvVar1;
}

Assistant:

inline void* Hashtable::put(const UnicodeString& key, void* value, UErrorCode& status) {
    return uhash_put(hash, new UnicodeString(key), value, &status);
}